

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

bool operator==(Entry *lhs,Entry *rhs)

{
  bool bVar1;
  tuple<const_Date_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_20;
  tuple<const_Date_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_10;
  
  local_10.
  super__Tuple_impl<0UL,_const_Date_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .
  super__Tuple_impl<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .
  super__Head_base<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  ._M_head_impl =
       (_Head_base<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
        )&lhs->event;
  local_20.
  super__Tuple_impl<0UL,_const_Date_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .
  super__Tuple_impl<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .
  super__Head_base<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  ._M_head_impl =
       (_Head_base<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
        )&rhs->event;
  local_20.
  super__Tuple_impl<0UL,_const_Date_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .super__Head_base<0UL,_const_Date_&,_false>._M_head_impl = &rhs->date;
  local_10.
  super__Tuple_impl<0UL,_const_Date_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .super__Head_base<0UL,_const_Date_&,_false>._M_head_impl = &lhs->date;
  bVar1 = std::
          __tuple_compare<std::tuple<const_Date_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_Date_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_0UL,_2UL>
          ::__eq(&local_10,&local_20);
  return bVar1;
}

Assistant:

bool operator==(const Entry &lhs, const Entry &rhs) {
    return tie(lhs.date, lhs.event) == tie(rhs.date, rhs.event);
}